

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O2

void __thiscall
GdlGlyphClassDefn::AssignGlyphAttrsToClassMembers
          (GdlGlyphClassDefn *this,GrcGlyphAttrMatrix *pgax,GdlRenderer *prndr,
          GrcLigComponentList *plclist,
          vector<GdlGlyphAttrSetting_*,_std::allocator<GdlGlyphAttrSetting_*>_> *vpglfaAttrs,
          int cgid,int *igid)

{
  pointer ppGVar1;
  GdlGlyphClassMember *pGVar2;
  size_t iglfd;
  ulong uVar3;
  
  for (uVar3 = 0;
      ppGVar1 = (this->m_vpglfdMembers).
                super__Vector_base<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->m_vpglfdMembers).
                            super__Vector_base<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar1 >> 3);
      uVar3 = uVar3 + 1) {
    pGVar2 = ppGVar1[uVar3];
    (*(pGVar2->super_GdlDefn)._vptr_GdlDefn[8])
              (pGVar2,pgax,prndr,plclist,vpglfaAttrs,(ulong)(uint)cgid,igid);
  }
  return;
}

Assistant:

void GdlGlyphClassDefn::AssignGlyphAttrsToClassMembers(GrcGlyphAttrMatrix * pgax,
	GdlRenderer * prndr, GrcLigComponentList * plclist,
	std::vector<GdlGlyphAttrSetting *> & vpglfaAttrs, int cgid, int & igid)
{
	for (size_t iglfd = 0; iglfd < m_vpglfdMembers.size(); iglfd++)
	{
		m_vpglfdMembers[iglfd]->AssignGlyphAttrsToClassMembers(pgax, prndr, plclist,
			vpglfaAttrs, cgid, igid);
	}
}